

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datefmt.cpp
# Opt level: O0

UnicodeString * __thiscall
icu_63::DateFormat::format
          (DateFormat *this,UDate date,UnicodeString *appendTo,FieldPosition *fieldPosition)

{
  UBool UVar1;
  int iVar2;
  undefined4 extraout_var;
  UErrorCode local_34;
  Calendar *pCStack_30;
  UErrorCode ec;
  Calendar *calClone;
  FieldPosition *fieldPosition_local;
  UnicodeString *appendTo_local;
  UDate date_local;
  DateFormat *this_local;
  
  fieldPosition_local = (FieldPosition *)appendTo;
  if (this->fCalendar != (Calendar *)0x0) {
    calClone = (Calendar *)fieldPosition;
    appendTo_local = (UnicodeString *)date;
    date_local = (UDate)this;
    iVar2 = (*(this->fCalendar->super_UObject)._vptr_UObject[3])();
    pCStack_30 = (Calendar *)CONCAT44(extraout_var,iVar2);
    if (pCStack_30 != (Calendar *)0x0) {
      local_34 = U_ZERO_ERROR;
      Calendar::setTime(pCStack_30,(UDate)appendTo_local,&local_34);
      UVar1 = ::U_SUCCESS(local_34);
      if (UVar1 != '\0') {
        (*(this->super_Format).super_UObject._vptr_UObject[8])
                  (this,pCStack_30,fieldPosition_local,calClone);
      }
      if (pCStack_30 != (Calendar *)0x0) {
        (*(pCStack_30->super_UObject)._vptr_UObject[1])();
      }
    }
  }
  return (UnicodeString *)fieldPosition_local;
}

Assistant:

UnicodeString&
DateFormat::format(UDate date, UnicodeString& appendTo, FieldPosition& fieldPosition) const {
    if (fCalendar != NULL) {
        // Use a clone of our calendar instance
        Calendar* calClone = fCalendar->clone();
        if (calClone != NULL) {
            UErrorCode ec = U_ZERO_ERROR;
            calClone->setTime(date, ec);
            if (U_SUCCESS(ec)) {
                format(*calClone, appendTo, fieldPosition);
            }
            delete calClone;
        }
    }
    return appendTo;
}